

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void equality(Vm *vm)

{
  _Bool _Var1;
  _Bool local_11;
  Vm *vm_local;
  
  comparison(vm);
  while( true ) {
    _Var1 = match(vm,TOKEN_EQUALS_EQUALS);
    local_11 = true;
    if (!_Var1) {
      local_11 = match(vm,TOKEN_BANG_EQUALS);
    }
    if (local_11 == false) break;
    if ((vm->compiler).previous.type == TOKEN_EQUALS_EQUALS) {
      comparison(vm);
      emit_no_arg(vm,OP_EQUAL);
    }
    else {
      comparison(vm);
      emit_no_arg(vm,OP_NOT_EQUAL);
    }
  }
  return;
}

Assistant:

static void equality(Vm *vm) {
    comparison(vm);

    while (match(vm, TOKEN_EQUALS_EQUALS) || match(vm, TOKEN_BANG_EQUALS)) {
        if (vm->compiler.previous.type == TOKEN_EQUALS_EQUALS) {
            comparison(vm);
            emit_no_arg(vm, OP_EQUAL);
        } else {
            comparison(vm);
            emit_no_arg(vm, OP_NOT_EQUAL);
        }
    }
}